

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerReflection::emit_type_member
          (CompilerReflection *this,SPIRType *type,uint32_t index)

{
  uint uVar1;
  Stream *pSVar2;
  char cVar3;
  bool bVar4;
  char cVar5;
  SPIRType *type_00;
  long *plVar6;
  undefined8 *puVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  size_type *psVar9;
  uint uVar10;
  _Alloc_hider _Var11;
  string name;
  string local_b0;
  string local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  uint local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  type_00 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr +
                       (type->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[index].id)
  ;
  simple_json::Stream::begin_json_object
            ((this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  to_member_name_abi_cxx11_(&local_50,this,type,index);
  pSVar2 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  paVar8 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"name","");
  simple_json::Stream::emit_json_key_value(pSVar2,&local_b0,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar8) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  bVar4 = type_is_reference(this,type_00);
  if (bVar4) {
    pSVar2 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_b0._M_dataplus._M_p = (pointer)paVar8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"type","");
    uVar1 = (type_00->parent_type).id;
    cVar5 = '\x01';
    if (9 < uVar1) {
      uVar10 = uVar1;
      cVar3 = '\x04';
      do {
        cVar5 = cVar3;
        if (uVar10 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_00297247;
        }
        if (uVar10 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_00297247;
        }
        if (uVar10 < 10000) goto LAB_00297247;
        bVar4 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar3 = cVar5 + '\x04';
      } while (bVar4);
      cVar5 = cVar5 + '\x01';
    }
LAB_00297247:
    local_70 = &local_60;
    ::std::__cxx11::string::_M_construct((ulong)&local_70,cVar5);
    ::std::__detail::__to_chars_10_impl<unsigned_int>(local_70->_M_local_buf,local_68,uVar1);
    plVar6 = (long *)::std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x366a8c);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_90.field_2._M_allocated_capacity = *psVar9;
      local_90.field_2._8_8_ = plVar6[3];
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar9;
      local_90._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_90._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    simple_json::Stream::emit_json_key_value(pSVar2,&local_b0,&local_90);
  }
  else {
    pSVar2 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (*(int *)&(type_00->super_IVariant).field_0xc != 0xf) {
      local_b0._M_dataplus._M_p = (pointer)paVar8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"type","");
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_90,this,type_00,0);
      simple_json::Stream::emit_json_key_value(pSVar2,&local_b0,&local_90);
      paVar8 = &local_90.field_2;
      _Var11._M_p = local_90._M_dataplus._M_p;
      goto LAB_002973b2;
    }
    local_b0._M_dataplus._M_p = (pointer)paVar8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"type","");
    uVar1 = (type_00->super_IVariant).self.id;
    cVar5 = '\x01';
    if (9 < uVar1) {
      uVar10 = uVar1;
      cVar3 = '\x04';
      do {
        cVar5 = cVar3;
        if (uVar10 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_002972f6;
        }
        if (uVar10 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_002972f6;
        }
        if (uVar10 < 10000) goto LAB_002972f6;
        bVar4 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar3 = cVar5 + '\x04';
      } while (bVar4);
      cVar5 = cVar5 + '\x01';
    }
LAB_002972f6:
    local_70 = &local_60;
    ::std::__cxx11::string::_M_construct((ulong)&local_70,cVar5);
    ::std::__detail::__to_chars_10_impl<unsigned_int>(local_70->_M_local_buf,local_68,uVar1);
    puVar7 = (undefined8 *)::std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x366a8c);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    psVar9 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_90.field_2._M_allocated_capacity = *psVar9;
      local_90.field_2._8_8_ = puVar7[3];
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar9;
      local_90._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_90._M_string_length = puVar7[1];
    *puVar7 = psVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    simple_json::Stream::emit_json_key_value(pSVar2,&local_b0,&local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  paVar8 = &local_60;
  _Var11._M_p = (pointer)local_70;
LAB_002973b2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var11._M_p != paVar8) {
    operator_delete(_Var11._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  emit_type_member_qualifiers(this,type,index);
  simple_json::Stream::end_json_object
            ((this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerReflection::emit_type_member(const SPIRType &type, uint32_t index)
{
	auto &membertype = get<SPIRType>(type.member_types[index]);
	json_stream->begin_json_object();
	auto name = to_member_name(type, index);
	// FIXME we'd like to emit the offset of each member, but such offsets are
	// context dependent.  See the comment above regarding structure sizes
	json_stream->emit_json_key_value("name", name);

	if (type_is_reference(membertype))
	{
		json_stream->emit_json_key_value("type", "_" + std::to_string(membertype.parent_type));
	}
	else if (membertype.basetype == SPIRType::Struct)
	{
		json_stream->emit_json_key_value("type", "_" + std::to_string(membertype.self));
	}
	else
	{
		json_stream->emit_json_key_value("type", type_to_glsl(membertype));
	}
	emit_type_member_qualifiers(type, index);
	json_stream->end_json_object();
}